

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CJumpStatement::Copy(CJumpStatement *this)

{
  _func_int **pp_Var1;
  INode local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x10);
  CLabelStatement::CastCopy((CLabelStatement *)&stack0xffffffffffffffe0);
  *pp_Var1 = (_func_int *)&PTR_Accept_0017b028;
  pp_Var1[1] = (_func_int *)local_20._vptr_INode;
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CJumpStatement::Copy( ) const {
    return std::move( std::unique_ptr<const CStatement>( new CJumpStatement( std::move(label->CastCopy()) )));
}